

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_search.c
# Opt level: O0

int killmatches(int cond)

{
  int iVar1;
  char *local_30;
  line *local_28;
  line *clp;
  int count;
  int error;
  int s;
  int cond_local;
  
  clp._4_4_ = 0;
  local_28 = curwp->w_dotp;
  if (curwp->w_doto == local_28->l_used) {
    local_28 = local_28->l_fp;
  }
  do {
    while( true ) {
      if (local_28 == curbp->b_headp) {
        ewprintf("%d line(s) deleted",(ulong)clp._4_4_);
        if (0 < (int)clp._4_4_) {
          curwp->w_rflag = curwp->w_rflag | 2;
        }
        return 1;
      }
      regex_match[0].rm_so = 0;
      regex_match[0].rm_eo = local_28->l_used;
      if (local_28->l_text == (char *)0x0) {
        local_30 = "";
      }
      else {
        local_30 = local_28->l_text;
      }
      iVar1 = regexec((regex_t *)&regex_buff,local_30,10,(regmatch_t *)regex_match,4);
      if (((cond == 0) && (iVar1 != 0)) || ((cond == 1 && (iVar1 == 0)))) break;
      local_28 = local_28->l_fp;
    }
    curwp->w_doto = 0;
    curwp->w_dotp = local_28;
    clp._4_4_ = clp._4_4_ + 1;
    iVar1 = ldelete(local_28->l_used + 1,0);
    local_28 = curwp->w_dotp;
    curwp->w_rflag = curwp->w_rflag | 2;
  } while (iVar1 != 0);
  return 0;
}

Assistant:

static int
killmatches(int cond)
{
	int	 s, error;
	int	 count = 0;
	struct line	*clp;

	clp = curwp->w_dotp;
	if (curwp->w_doto == llength(clp))
		/* Consider dot on next line */
		clp = lforw(clp);

	while (clp != (curbp->b_headp)) {
		/* see if line matches */
		regex_match[0].rm_so = 0;
		regex_match[0].rm_eo = llength(clp);
		error = regexec(&regex_buff, ltext(clp) ? ltext(clp) : "",
		    RE_NMATCH, regex_match, REG_STARTEND);

		/* Delete line when appropriate */
		if ((cond == FALSE && error) || (cond == TRUE && !error)) {
			curwp->w_doto = 0;
			curwp->w_dotp = clp;
			count++;
			s = ldelete(llength(clp) + 1, KNONE);
			clp = curwp->w_dotp;
			curwp->w_rflag |= WFMOVE;
			if (s == FALSE)
				return (FALSE);
		} else
			clp = lforw(clp);
	}

	ewprintf("%d line(s) deleted", count);
	if (count > 0)
		curwp->w_rflag |= WFMOVE;

	return (TRUE);
}